

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

ExactFloat __thiscall
util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::operator[]
          (BasicVector<Vector3,_ExactFloat,_3UL> *this,int b)

{
  ostream *poVar1;
  ExactFloat *pEVar2;
  int in_EDX;
  BigNum extraout_RDX;
  undefined4 in_register_00000034;
  Vector3<ExactFloat> *this_00;
  ExactFloat EVar3;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [20];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_1d;
  int local_1c;
  Vector3<ExactFloat> *pVStack_18;
  int b_local;
  BasicVector<Vector3,_ExactFloat,_3UL> *this_local;
  
  this_00 = (Vector3<ExactFloat> *)CONCAT44(in_register_00000034,b);
  local_31 = 0;
  local_1c = in_EDX;
  pVStack_18 = this_00;
  this_local = this;
  if (in_EDX < 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/vector.h"
               ,0x59,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar1 = S2LogMessage::stream(&local_30);
    poVar1 = std::operator<<(poVar1,"Check failed: (b) >= (0) ");
    S2LogMessageVoidify::operator&(&local_1d,poVar1);
  }
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  if (2 < local_1c) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/vector.h"
               ,0x5a,kFatal,(ostream *)&std::cerr);
    poVar1 = S2LogMessage::stream(&local_58);
    poVar1 = std::operator<<(poVar1,"Check failed: (b) < (SIZE) ");
    S2LogMessageVoidify::operator&(local_45,poVar1);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
  }
  pEVar2 = Vector3<ExactFloat>::Data(this_00);
  ExactFloat::ExactFloat((ExactFloat *)this,pEVar2 + local_1c);
  EVar3.bn_.bn_ = extraout_RDX.bn_;
  EVar3._0_8_ = this;
  return EVar3;
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }